

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

int __thiscall vkt::ssbo::SSBOLayoutCase::init(SSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *interface;
  _Base_ptr p_Var1;
  uint uVar2;
  Precision PVar3;
  DataType dataType;
  MatrixLoadFlags MVar4;
  _Rb_tree_color _Var5;
  BufferBlock *pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  _Alloc_hider _Var10;
  iterator __position;
  pointer pBVar11;
  pointer pBVar12;
  void *pvVar13;
  VarType *pVVar14;
  BufferLayout *layout;
  int iVar15;
  DataType DVar16;
  int iVar17;
  deUint32 dVar18;
  int iVar19;
  undefined8 *puVar20;
  pointer pBVar21;
  long *plVar22;
  long lVar23;
  undefined8 *puVar24;
  ostream *poVar25;
  size_t sVar26;
  _Rb_tree_node_base *p_Var27;
  _Base_ptr p_Var28;
  pointer ppBVar29;
  pointer extraout_RAX;
  pointer pcVar30;
  int *piVar31;
  long *plVar32;
  size_type *psVar33;
  _Base_ptr p_Var34;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *pvVar35;
  BufferBlock *block;
  DataType elemBasicType;
  uint uVar36;
  pointer ppSVar37;
  VarType *pVVar38;
  DataType DVar39;
  uint uVar40;
  ulong uVar41;
  int type;
  int iVar42;
  char *pcVar43;
  bool bVar44;
  bool bVar45;
  string blockPrefix;
  BufferVarLayoutEntry entry;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> namedStructs;
  string prefix;
  undefined4 in_stack_fffffffffffffb24;
  SSBOLayoutCase *pSVar46;
  long local_4d0;
  undefined1 local_4c0 [32];
  _Base_ptr local_4a0;
  size_t local_498;
  pointer local_490;
  ulong local_488;
  BufferLayout *local_480;
  long *local_478;
  undefined8 local_470;
  long local_468;
  undefined8 uStack_460;
  ulong local_458;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *local_450;
  ShaderInterface *local_448;
  allocator<char> local_439;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  ulong local_418;
  long *local_410;
  long local_408;
  long local_400;
  long lStack_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [24];
  undefined8 local_3b0;
  Data DStack_3a8;
  deUint32 dStack_398;
  int iStack_394;
  bool local_390;
  ios_base local_360 [264];
  undefined1 local_258 [16];
  pointer local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_480 = &this->m_refLayout;
  local_418 = (ulong)((long)(this->m_interface).m_bufferBlocks.
                            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_interface).m_bufferBlocks.
                           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)(uint)local_418) {
    local_448 = (ShaderInterface *)&(this->m_refLayout).bufferVars;
    local_418 = (ulong)((uint)local_418 & 0x7fffffff);
    uVar41 = 0;
    do {
      pBVar6 = (this->m_interface).m_bufferBlocks.
               super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar41];
      bVar44 = (pBVar6->m_instanceName)._M_string_length == 0;
      bVar45 = (pBVar6->m_instanceName)._M_dataplus._M_p == (pointer)0x0;
      pSVar46 = this;
      if (bVar45 || bVar44) {
        psVar33 = (size_type *)(local_4c0 + 0x10);
        puVar24 = (undefined8 *)(local_4c0 + 8);
        local_4c0._0_8_ = psVar33;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_228,(pBVar6->m_blockName)._M_dataplus._M_p,&local_439);
        puVar20 = (undefined8 *)std::__cxx11::string::append((char *)local_228);
        local_4c0._0_8_ = local_4c0 + 0x10;
        psVar33 = puVar20 + 2;
        if ((size_type *)*puVar20 == psVar33) {
          local_4c0._16_8_ = *psVar33;
          local_4c0._24_8_ = puVar20[3];
        }
        else {
          local_4c0._16_8_ = *psVar33;
          local_4c0._0_8_ = (size_type *)*puVar20;
        }
        puVar24 = puVar20 + 1;
        local_4c0._8_8_ = puVar20[1];
        *puVar20 = psVar33;
      }
      *puVar24 = 0;
      *(undefined1 *)psVar33 = 0;
      if ((!bVar45 && !bVar44) && (local_228[0] != local_218)) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      local_238 = (long)(this->m_refLayout).bufferVars.
                        super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_refLayout).bufferVars.
                        super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      pBVar21 = (pBVar6->m_variables).
                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar17 = 0;
      uVar40 = 0;
      this = pSVar46;
      local_240 = uVar41;
      if (pBVar21 !=
          *(pointer *)
           ((long)&(pBVar6->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl + 8)) {
        local_458 = (ulong)((long)(pSVar46->m_refLayout).blocks.
                                  super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar46->m_refLayout).blocks.
                                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6;
        uVar41 = 0;
        do {
          uVar40 = pBVar6->m_flags;
          pVVar38 = &pBVar21->m_type;
          uVar2 = pBVar21->m_flags;
          uVar36 = uVar2;
          if ((uVar2 & 3) == 0) {
            uVar36 = uVar40;
          }
          if ((uVar2 & 0xc) == 0) {
            uVar2 = uVar40;
          }
          uVar36 = uVar2 & 0xc | uVar36 & 3;
          local_490 = pBVar21;
          local_450 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                      uVar41;
          if ((pBVar21->m_type).m_type == TYPE_ARRAY) {
            local_488 = CONCAT44(local_488._4_4_,uVar40);
            PVar3 = (pBVar21->m_type).m_data.array.size;
            if (PVar3 == ~PRECISION_LOWP) {
              PVar3 = PRECISION_LOWP;
            }
            local_3d0 = (undefined1  [8])(local_3c8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,local_4c0._0_8_,
                       (pointer)(local_4c0._0_8_ + local_4c0._8_8_));
            std::__cxx11::string::append((char *)local_3d0);
            plVar22 = (long *)std::__cxx11::string::append((char *)local_3d0);
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            psVar33 = (size_type *)(plVar22 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar22 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar33) {
              local_1a8[0].field_2._0_8_ = *psVar33;
              local_1a8[0].field_2._8_8_ = plVar22[3];
            }
            else {
              local_1a8[0].field_2._0_8_ = *psVar33;
              local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
            }
            local_1a8[0]._M_string_length = plVar22[1];
            *plVar22 = (long)psVar33;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
              operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
            }
            if ((local_488 & 1) == 0) {
              iVar15 = anon_unknown_15::computeStd430BaseAlignment(pVVar38,uVar36);
            }
            else {
              iVar15 = anon_unknown_15::computeStd140BaseAlignment(pVVar38,uVar36);
            }
            DVar39 = -iVar15 & ((int)local_450 + iVar15) - TYPE_FLOAT;
            pVVar38 = (local_490->m_type).m_data.array.elementType;
            if (pVVar38->m_type == TYPE_BASIC) {
              dataType = (pVVar38->m_data).basic.type;
              if (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9) {
                if ((uVar2 & 4) == 0) {
                  iVar15 = glu::getDataTypeMatrixNumRows(dataType);
                  iVar42 = glu::getDataTypeMatrixNumColumns(dataType);
                }
                else {
                  iVar15 = glu::getDataTypeMatrixNumColumns(dataType);
                  iVar42 = glu::getDataTypeMatrixNumRows(dataType);
                }
                DVar16 = glu::getDataTypeFloatVec(iVar15);
                uVar40 = 0;
                if (DVar16 - TYPE_FLOAT < 0x26) {
                  uVar40 = *(uint *)(&DAT_00b2fd58 + (ulong)(DVar16 - TYPE_FLOAT) * 4);
                }
                local_3d0 = (undefined1  [8])(local_3c8 + 8);
                local_3c8._0_4_ = TYPE_INVALID;
                local_3c8._4_4_ = PRECISION_LOWP;
                local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
                DStack_3a8._12_4_ = -1;
                dStack_398 = 0xffffffff;
                iStack_394 = -1;
                local_3b0 = (_Base_ptr)0xffffffff0000005e;
                DStack_3a8.basic.type = ~TYPE_INVALID;
                DStack_3a8.basic.precision = ~PRECISION_LOWP;
                DStack_3a8.array.size = -1;
                local_390 = false;
                local_230 = (ulong)dataType;
                std::__cxx11::string::_M_assign((string *)local_3d0);
                DStack_3a8._12_4_ = uVar40 + 0xf & 0x30;
                if ((local_488 & 1) == 0) {
                  DStack_3a8._12_4_ = uVar40;
                }
                dStack_398 = 1;
                iStack_394 = 0;
                local_3b0 = (_Base_ptr)CONCAT44((int)local_458,(int)local_230);
                uVar36 = iVar42 * DStack_3a8._12_4_;
                local_390 = SUB41((uVar2 & 4) >> 2,0);
                DStack_3a8.basic.type = DVar39;
                DStack_3a8.basic.precision = PVar3;
                DStack_3a8.array.size = uVar36;
                std::
                vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ::push_back((vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                             *)local_448,(value_type *)local_3d0);
              }
              else {
                uVar40 = 0;
                if (dataType - TYPE_FLOAT < 0x26) {
                  uVar40 = *(uint *)(&DAT_00b2fd58 + (ulong)(dataType - TYPE_FLOAT) * 4);
                }
                uVar36 = uVar40 + 0xf & 0x30;
                if ((local_488 & 1) == 0) {
                  uVar36 = uVar40;
                }
                local_3d0 = (undefined1  [8])(local_3c8 + 8);
                local_3c8._0_4_ = TYPE_INVALID;
                local_3c8._4_4_ = PRECISION_LOWP;
                local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
                DStack_3a8._12_4_ = -1;
                dStack_398 = 0xffffffff;
                iStack_394 = -1;
                local_3b0 = (_Base_ptr)0xffffffff0000005e;
                DStack_3a8.basic.type = ~TYPE_INVALID;
                DStack_3a8.basic.precision = ~PRECISION_LOWP;
                DStack_3a8.array.size = -1;
                local_390 = false;
                std::__cxx11::string::_M_assign((string *)local_3d0);
                iStack_394 = 0;
                local_3b0 = (_Base_ptr)CONCAT44((int)local_458,dataType);
                DStack_3a8._12_4_ = 0;
                dStack_398 = 1;
                DStack_3a8.basic.type = DVar39;
                DStack_3a8.basic.precision = PVar3;
                DStack_3a8.array.size = uVar36;
                std::
                vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                ::push_back((vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                             *)local_448,(value_type *)local_3d0);
              }
              this = pSVar46;
              if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
                operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
                this = pSVar46;
              }
            }
            else {
              pBVar7 = (pSVar46->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pBVar8 = (pSVar46->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              this = pSVar46;
              uVar36 = anon_unknown_15::computeReferenceLayout
                                 (local_480,(int)local_458,DVar39,local_1a8,pVVar38,uVar36);
              iVar42 = (int)((long)pBVar8 - (long)pBVar7 >> 3) * 0x38e38e39;
              pBVar7 = (pSVar46->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar15 = (int)((long)(pSVar46->m_refLayout).bufferVars.
                                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7 >> 3) *
                       0x38e38e39;
              if (iVar42 < iVar15) {
                lVar23 = (long)iVar15 - (long)iVar42;
                piVar31 = &pBVar7[iVar42].topLevelArrayStride;
                do {
                  piVar31[-1] = PVar3;
                  *piVar31 = uVar36;
                  piVar31 = piVar31 + 0x12;
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            iVar42 = (int)local_450;
            iVar15 = (DVar39 - iVar42) + uVar36 * PVar3;
          }
          else {
            local_3d0 = (undefined1  [8])(local_3c8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3d0,local_4c0._0_8_,
                       (pointer)(local_4c0._0_8_ + local_4c0._8_8_));
            std::__cxx11::string::append((char *)local_3d0);
            iVar15 = anon_unknown_15::computeReferenceLayout
                               (local_480,(int)local_458,(int)local_450,(string *)local_3d0,pVVar38,
                                uVar36);
            this = pSVar46;
            if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
              operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
              this = pSVar46;
            }
            iVar42 = (int)local_450;
          }
          uVar40 = iVar15 + iVar42;
          pBVar21 = local_490 + 1;
          uVar41 = (ulong)uVar40;
          pSVar46 = this;
        } while (pBVar21 !=
                 *(pointer *)
                  ((long)&(pBVar6->m_variables).
                          super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                          ._M_impl + 8));
      }
      local_490 = (pointer)CONCAT44(local_490._4_4_,(int)(local_238 >> 3) * 0x38e38e39);
      iVar42 = (int)((ulong)((long)(this->m_refLayout).bufferVars.
                                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_refLayout).bufferVars.
                                  super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar15 = pBVar6->m_arraySize;
      if (pBVar6->m_arraySize < 2) {
        iVar15 = 1;
      }
      local_450 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                  CONCAT44(local_450._4_4_,iVar15);
      do {
        local_3d0 = (undefined1  [8])(local_3c8 + 8);
        local_3c8._0_4_ = TYPE_INVALID;
        local_3c8._4_4_ = PRECISION_LOWP;
        local_3c8._8_8_ = local_3c8._8_8_ & 0xffffffffffffff00;
        local_3b0 = (_Base_ptr)((ulong)local_3b0 & 0xffffffff00000000);
        dStack_398 = 0;
        iStack_394 = 0;
        DStack_3a8.basic.type = TYPE_INVALID;
        DStack_3a8.basic.precision = PRECISION_LOWP;
        DStack_3a8.array.size = 0;
        DStack_3a8._12_4_ = 0;
        std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
        emplace_back<vkt::ssbo::BlockLayoutEntry>(&local_480->blocks,(BlockLayoutEntry *)local_3d0);
        pvVar13 = (void *)CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type);
        if (pvVar13 != (void *)0x0) {
          operator_delete(pvVar13,CONCAT44(iStack_394,dStack_398) - (long)pvVar13);
        }
        if (local_3d0 != (undefined1  [8])(local_3c8 + 8)) {
          operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
        }
        pBVar9 = (this->m_refLayout).blocks.
                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var10._M_p = (pBVar6->m_blockName)._M_dataplus._M_p;
        pcVar43 = (char *)pBVar9[-1].name._M_string_length;
        strlen(_Var10._M_p);
        std::__cxx11::string::_M_replace((ulong)(pBVar9 + -1),0,pcVar43,(ulong)_Var10._M_p);
        pBVar9[-1].size = uVar40;
        local_3d0._0_4_ = (int)local_490;
        if (SBORROW4((int)local_490,iVar42 * 0x38e38e39) !=
            (int)local_490 + iVar42 * -0x38e38e39 < 0) {
          iVar15 = (int)local_490;
          do {
            __position._M_current =
                 pBVar9[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar9[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar9[-1].activeVarIndices,__position,
                         (int *)local_3d0);
            }
            else {
              *__position._M_current = iVar15;
              pBVar9[-1].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar15 = local_3d0._0_4_ + TYPE_ARRAY;
            local_3d0._0_4_ = iVar15;
          } while (SBORROW4(iVar15,iVar42 * 0x38e38e39) != iVar15 + iVar42 * -0x38e38e39 < 0);
        }
        if (0 < pBVar6->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((ostringstream *)local_3d0,iVar17);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          puVar24 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0xb561c0);
          local_478 = &local_468;
          plVar22 = puVar24 + 2;
          if ((long *)*puVar24 == plVar22) {
            local_468 = *plVar22;
            uStack_460 = puVar24[3];
          }
          else {
            local_468 = *plVar22;
            local_478 = (long *)*puVar24;
          }
          local_470 = puVar24[1];
          *puVar24 = plVar22;
          puVar24[1] = 0;
          *(undefined1 *)(puVar24 + 2) = 0;
          plVar22 = (long *)std::__cxx11::string::append((char *)&local_478);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          psVar33 = (size_type *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar33) {
            local_1a8[0].field_2._0_8_ = *psVar33;
            local_1a8[0].field_2._8_8_ = plVar22[3];
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar33;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
          }
          local_1a8[0]._M_string_length = plVar22[1];
          *plVar22 = (long)psVar33;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)(pBVar9 + -1),(ulong)local_1a8[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (local_478 != &local_468) {
            operator_delete(local_478,local_468 + 1);
          }
          if (local_438 != &local_428) {
            operator_delete(local_438,local_428 + 1);
          }
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != (int)local_450);
      if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      uVar41 = local_240 + 1;
    } while (uVar41 != local_418);
  }
  layout = local_480;
  interface = &this->m_interface;
  pSVar46 = this;
  anon_unknown_15::initRefDataStorage(interface,local_480,&this->m_initialData);
  local_448 = interface;
  anon_unknown_15::initRefDataStorage(interface,layout,&this->m_writeData);
  pvVar35 = &(this->m_initialData).pointers;
  dVar18 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  local_490 = (pointer)pvVar35;
  anon_unknown_15::generateValues(layout,pvVar35,dVar18 ^ 0xad2f7214);
  pvVar35 = &(this->m_writeData).pointers;
  dVar18 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  local_450 = pvVar35;
  anon_unknown_15::generateValues(layout,pvVar35,dVar18 ^ 0x25ca4e7);
  ppBVar29 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29) >> 3)) {
    uVar41 = 0;
    do {
      pBVar6 = ppBVar29[uVar41];
      iVar17 = pBVar6->m_arraySize;
      iVar15 = 1;
      if (1 < iVar17) {
        iVar15 = iVar17;
      }
      local_458 = CONCAT71(local_458._1_7_,0 < iVar17);
      if (iVar17 < 1) {
        iVar15 = 1;
      }
      iVar42 = 0;
      local_488 = uVar41;
      do {
        psVar33 = (size_type *)(local_4c0 + 0x10);
        pcVar43 = (pBVar6->m_blockName)._M_dataplus._M_p;
        if (iVar17 < 1) {
          puVar24 = (undefined8 *)(local_4c0 + 8);
          local_4c0._0_8_ = psVar33;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
          std::ostream::operator<<((SubTypeAccess *)local_3d0,iVar42);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
          std::ios_base::~ios_base(local_360);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xb561c0);
          plVar32 = plVar22 + 2;
          if ((long *)*plVar22 == plVar32) {
            local_3e0 = *plVar32;
            lStack_3d8 = plVar22[3];
            local_3f0 = &local_3e0;
          }
          else {
            local_3e0 = *plVar32;
            local_3f0 = (long *)*plVar22;
          }
          local_3e8 = plVar22[1];
          *plVar22 = (long)plVar32;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
          local_4c0._0_8_ = local_4c0 + 0x10;
          psVar33 = puVar20 + 2;
          if ((size_type *)*puVar20 == psVar33) {
            local_4c0._16_8_ = *psVar33;
            local_4c0._24_8_ = puVar20[3];
          }
          else {
            local_4c0._16_8_ = *psVar33;
            local_4c0._0_8_ = (size_type *)*puVar20;
          }
          puVar24 = puVar20 + 1;
          local_4c0._8_8_ = puVar20[1];
          *puVar20 = psVar33;
        }
        *puVar24 = 0;
        *(undefined1 *)psVar33 = 0;
        strlen(pcVar43);
        plVar22 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4c0,0,(char *)0x0,(ulong)pcVar43);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar33 = (size_type *)(plVar22 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar22 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar33) {
          local_1a8[0].field_2._0_8_ = *psVar33;
          local_1a8[0].field_2._8_8_ = plVar22[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar33;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar22;
        }
        local_1a8[0]._M_string_length = plVar22[1];
        *plVar22 = (long)psVar33;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
          operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
        }
        if (0 < iVar17) {
          if (local_3f0 != &local_3e0) {
            operator_delete(local_3f0,local_3e0 + 1);
          }
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] + 1);
          }
        }
        iVar19 = BufferLayout::getBlockIndex(local_480,local_1a8);
        pBVar21 = (pBVar6->m_variables).
                  super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (pBVar21 !=
            (pBVar6->m_variables).
            super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pBVar11 = (((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                       *)&local_490->m_name)->_M_impl).super__Vector_impl_data._M_start;
          pBVar12 = (local_450->
                    super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pVVar38 = &pBVar21->m_type;
          do {
            if ((pVVar38[1].m_type & 0x400) == TYPE_BASIC) {
              glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar38);
              anon_unknown_15::copyNonWrittenData
                        (local_480,pBVar6,iVar42,pBVar11 + iVar19,pBVar12 + iVar19,
                         (BufferVar *)((long)&pVVar38[-2].m_data + 8),(SubTypeAccess *)local_3d0);
              if ((Data *)local_3c8._16_8_ != (Data *)0x0) {
                operator_delete((void *)local_3c8._16_8_,
                                CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                local_3c8._16_8_);
              }
              glu::VarType::~VarType((VarType *)local_3d0);
            }
            pVVar14 = pVVar38 + 1;
            pVVar38 = (VarType *)((long)&pVVar38[2].m_data + 8);
          } while ((pointer)&pVVar14->m_data !=
                   (pBVar6->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        iVar42 = iVar42 + 1;
      } while (iVar42 != iVar15);
      uVar41 = local_488 + 1;
      ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)uVar41 <
             (long)(int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                       super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29)
                        >> 3));
  }
  MVar4 = pSVar46->m_matrixLoadFlag;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(local_size_x = 1) in;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(std140, binding = 0) buffer AcBlock { highp uint ac_numPassed; };\n\n",0x4a);
  local_258 = (undefined1  [16])0x0;
  local_248 = (pointer)0x0;
  ShaderInterface::getNamedStructs
            (local_448,
             (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *)local_258)
  ;
  if (local_258._0_8_ != local_258._8_8_) {
    ppSVar37 = (pointer)local_258._0_8_;
    do {
      local_3d0 = (undefined1  [8])*ppSVar37;
      local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
      poVar25 = glu::decl::operator<<((ostream *)local_1a8,(DeclareStructTypePtr *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,";\n",2);
      ppSVar37 = ppSVar37 + 1;
    } while (ppSVar37 != (pointer)local_258._8_8_);
  }
  local_4d0 = 0;
  while (ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                    super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        local_4d0 <
        (int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29) >> 3)) {
    pBVar6 = ppBVar29[local_4d0];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
    if ((pBVar6->m_flags & 0xf) != 0) {
      local_3d0 = (undefined1  [8])(CONCAT44(local_3d0._4_4_,pBVar6->m_flags) & 0xffffffff0000000f);
      ssbo::operator<<((ostream *)local_1a8,(LayoutFlagsFmt *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"binding = ",10);
    local_4d0 = local_4d0 + 1;
    std::ostream::operator<<(local_1a8,(int)local_4d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"buffer ",7);
    _Var10._M_p = (pBVar6->m_blockName)._M_dataplus._M_p;
    if (_Var10._M_p == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffb18 +
                      (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x340);
    }
    else {
      sVar26 = strlen(_Var10._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var10._M_p,sVar26);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n{\n",3);
    for (pBVar21 = (pBVar6->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar21 !=
        *(pointer *)
         ((long)&(pBVar6->m_variables).
                 super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                 _M_impl + 8); pBVar21 = pBVar21 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t",1);
      if ((pBVar21->m_flags & 0xf) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"layout(",7);
        local_3d0 = (undefined1  [8])
                    (CONCAT44(local_3d0._4_4_,pBVar21->m_flags) & 0xffffffff0000000f);
        ssbo::operator<<((ostream *)local_1a8,(LayoutFlagsFmt *)local_3d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") ",2);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4c0,(pBVar21->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_478);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)local_3d0,&pBVar21->m_type,(string *)local_4c0,1);
      glu::decl::operator<<((ostream *)local_1a8,(DeclareVariable *)local_3d0);
      if ((Data *)local_3c8._16_8_ != &DStack_3a8) {
        operator_delete((void *)local_3c8._16_8_,
                        CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) + 1);
      }
      glu::VarType::~VarType((VarType *)local_3d0);
      if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
    if (((pBVar6->m_instanceName)._M_string_length != 0) &&
       ((pBVar6->m_instanceName)._M_dataplus._M_p != (pointer)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar43 = (pBVar6->m_instanceName)._M_dataplus._M_p;
      if (pcVar43 == (char *)0x0 || (pBVar6->m_instanceName)._M_string_length == 0) {
        std::ios::clear((int)&stack0xfffffffffffffb18 +
                        (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x340);
      }
      else {
        sVar26 = strlen(pcVar43);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar43,sVar26);
      }
      if (0 < pBVar6->m_arraySize) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar25 = (ostream *)std::ostream::operator<<(local_1a8,pBVar6->m_arraySize);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
  local_3c8._8_8_ = 0;
  local_3c8._16_8_ = (_Rb_tree_node_base *)local_3c8;
  local_3b0 = (_Rb_tree_node_base *)local_3c8;
  DStack_3a8.basic.type = TYPE_INVALID;
  DStack_3a8.basic.precision = PRECISION_LOWP;
  local_4c0._8_8_ = local_4c0._8_8_ & 0xffffffff00000000;
  local_4c0._16_8_ = (undefined1 *)0x0;
  p_Var1 = (_Base_ptr)(local_4c0 + 8);
  local_498 = 0;
  ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_4c0._24_8_ = p_Var1;
  local_4a0 = p_Var1;
  if (0 < (int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29) >> 3)) {
    lVar23 = 0;
    do {
      pBVar6 = ppBVar29[lVar23];
      for (pBVar21 = (pBVar6->m_variables).
                     super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pBVar21 !=
          *(pointer *)
           ((long)&(pBVar6->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl + 8); pBVar21 = pBVar21 + 1) {
        anon_unknown_15::collectUniqueBasicTypes
                  ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                   local_3d0,&pBVar21->m_type);
      }
      lVar23 = lVar23 + 1;
      ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar23 < (int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                          super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppBVar29) >> 3));
  }
  if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)local_3c8) {
    p_Var27 = (_Rb_tree_node_base *)local_3c8._16_8_;
    do {
      _Var5 = p_Var27[1]._M_color;
      local_478 = (long *)CONCAT44(local_478._4_4_,_Var5);
      if (_Var5 - 5 < 9) {
        local_438._0_4_ = 1;
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>
                  ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                    *)local_4c0,(DataType *)&local_438);
        iVar17 = glu::getDataTypeMatrixNumRows((DataType)local_478);
        DVar39 = glu::getDataTypeFloatVec(iVar17);
        local_438 = (long *)CONCAT44(local_438._4_4_,DVar39);
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>
                  ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                    *)local_4c0,(DataType *)&local_438);
      }
      else if (_Var5 + ~_S_black < 3) {
        local_438 = (long *)CONCAT44(local_438._4_4_,1);
        std::
        _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
        ::_M_insert_unique<glu::DataType>
                  ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                    *)local_4c0,(DataType *)&local_438);
      }
      std::
      _Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
      ::_M_insert_unique<glu::DataType_const&>
                ((_Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
                  *)local_4c0,(DataType *)&local_478);
      p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27);
    } while (p_Var27 != (_Rb_tree_node_base *)local_3c8);
  }
  iVar17 = 0;
  p_Var28 = p_Var1;
  p_Var34 = (_Base_ptr)local_4c0._16_8_;
  do {
    for (; p_Var34 != (_Base_ptr)0x0;
        p_Var34 = (&p_Var34->_M_left)[(int)p_Var34[1]._M_color < iVar17]) {
      if (iVar17 <= (int)p_Var34[1]._M_color) {
        p_Var28 = p_Var34;
      }
    }
    p_Var34 = p_Var1;
    if ((p_Var28 != p_Var1) && (p_Var34 = p_Var28, iVar17 < (int)p_Var28[1]._M_color)) {
      p_Var34 = p_Var1;
    }
    if (p_Var34 == p_Var1) goto LAB_006b7b2a;
    switch(iVar17) {
    case 1:
      bVar44 = false;
      pcVar43 = 
      "bool compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05; }\n";
      goto LAB_006b7aec;
    case 2:
      pcVar43 = 
      "bool compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)&&compare_float(a.y, b.y); }\n"
      ;
      break;
    case 3:
      pcVar43 = 
      "bool compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)&&compare_float(a.y, b.y)&&compare_float(a.z, b.z); }\n"
      ;
      break;
    case 4:
      pcVar43 = 
      "bool compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)&&compare_float(a.y, b.y)&&compare_float(a.z, b.z)&&compare_float(a.w, b.w); }\n"
      ;
      break;
    case 5:
      pcVar43 = 
      "bool compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])&&compare_vec2(a[1], b[1]); }\n"
      ;
      break;
    case 6:
      pcVar43 = 
      "bool compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])&&compare_vec3(a[1], b[1]); }\n"
      ;
      break;
    case 7:
      pcVar43 = 
      "bool compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])&&compare_vec4(a[1], b[1]); }\n"
      ;
      break;
    case 8:
      pcVar43 = 
      "bool compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])&&compare_vec2(a[1], b[1])&&compare_vec2(a[2], b[2]); }\n"
      ;
      break;
    case 9:
      pcVar43 = 
      "bool compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])&&compare_vec3(a[1], b[1])&&compare_vec3(a[2], b[2]); }\n"
      ;
      break;
    case 10:
      pcVar43 = 
      "bool compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])&&compare_vec4(a[1], b[1])&&compare_vec4(a[2], b[2]); }\n"
      ;
      break;
    case 0xb:
      pcVar43 = 
      "bool compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])&&compare_vec2(a[1], b[1])&&compare_vec2(a[2], b[2])&&compare_vec2(a[3], b[3]); }\n"
      ;
      break;
    case 0xc:
      pcVar43 = 
      "bool compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])&&compare_vec3(a[1], b[1])&&compare_vec3(a[2], b[2])&&compare_vec3(a[3], b[3]); }\n"
      ;
      break;
    case 0xd:
      pcVar43 = 
      "bool compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])&&compare_vec4(a[1], b[1])&&compare_vec4(a[2], b[2])&&compare_vec4(a[3], b[3]); }\n"
      ;
      break;
    default:
      bVar44 = true;
      pcVar43 = (char *)0x0;
      goto LAB_006b7aec;
    case 0x1b:
      pcVar43 = "bool compare_int      (highp int a, highp int b)      { return a == b; }\n";
      break;
    case 0x1c:
      pcVar43 = "bool compare_ivec2    (highp ivec2 a, highp ivec2 b)  { return a == b; }\n";
      break;
    case 0x1d:
      pcVar43 = "bool compare_ivec3    (highp ivec3 a, highp ivec3 b)  { return a == b; }\n";
      break;
    case 0x1e:
      pcVar43 = "bool compare_ivec4    (highp ivec4 a, highp ivec4 b)  { return a == b; }\n";
      break;
    case 0x1f:
      pcVar43 = "bool compare_uint     (highp uint a, highp uint b)    { return a == b; }\n";
      break;
    case 0x20:
      pcVar43 = "bool compare_uvec2    (highp uvec2 a, highp uvec2 b)  { return a == b; }\n";
      break;
    case 0x21:
      pcVar43 = "bool compare_uvec3    (highp uvec3 a, highp uvec3 b)  { return a == b; }\n";
      break;
    case 0x22:
      pcVar43 = "bool compare_uvec4    (highp uvec4 a, highp uvec4 b)  { return a == b; }\n";
      break;
    case 0x23:
      pcVar43 = "bool compare_bool     (bool a, bool b)                { return a == b; }\n";
      break;
    case 0x24:
      pcVar43 = "bool compare_bvec2    (bvec2 a, bvec2 b)              { return a == b; }\n";
      break;
    case 0x25:
      pcVar43 = "bool compare_bvec3    (bvec3 a, bvec3 b)              { return a == b; }\n";
      break;
    case 0x26:
      pcVar43 = "bool compare_bvec4    (bvec4 a, bvec4 b)              { return a == b; }\n";
    }
    bVar44 = false;
LAB_006b7aec:
    if (bVar44) {
      std::ios::clear((int)&stack0xfffffffffffffb18 +
                      (int)*(undefined8 *)((long)local_1a8[0]._M_dataplus._M_p + -0x18) + 0x340);
    }
    else {
      sVar26 = strlen(pcVar43);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar43,sVar26);
    }
LAB_006b7b2a:
    iVar17 = iVar17 + 1;
    p_Var28 = p_Var1;
    p_Var34 = (_Base_ptr)local_4c0._16_8_;
    if (iVar17 == 0x5e) {
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                   *)local_4c0);
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                   *)local_3d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\nvoid main (void)\n{\n\tbool allOk = true;\n",0x28);
      ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29) >> 3)
         ) {
        uVar41 = 0;
        do {
          pBVar6 = ppBVar29[uVar41];
          iVar17 = pBVar6->m_arraySize;
          iVar15 = 1;
          if (1 < iVar17) {
            iVar15 = iVar17;
          }
          local_448 = (ShaderInterface *)CONCAT71(local_448._1_7_,0 < iVar17);
          if (iVar17 < 1) {
            iVar15 = 1;
          }
          local_488 = CONCAT44(local_488._4_4_,iVar15);
          block = (BufferBlock *)0x0;
          local_458 = uVar41;
          do {
            pBVar9 = (((_Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                        *)&(pBVar6->m_blockName)._M_dataplus)->_M_impl).super__Vector_impl_data.
                     _M_start;
            if (iVar17 < 1) {
              puVar24 = &local_470;
              plVar22 = &local_468;
              local_478 = &local_468;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
              std::ostream::operator<<((BufferVar *)local_3d0,(int)block);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
              std::ios_base::~ios_base(local_360);
              plVar22 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_1e8,0,(char *)0x0,0xb561c0);
              local_410 = &local_400;
              plVar32 = plVar22 + 2;
              if ((long *)*plVar22 == plVar32) {
                local_400 = *plVar32;
                lStack_3f8 = plVar22[3];
              }
              else {
                local_400 = *plVar32;
                local_410 = (long *)*plVar22;
              }
              local_408 = plVar22[1];
              *plVar22 = (long)plVar32;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_410);
              plVar22 = puVar20 + 2;
              if ((long *)*puVar20 == plVar22) {
                local_468 = *plVar22;
                uStack_460 = puVar20[3];
                local_478 = &local_468;
              }
              else {
                local_468 = *plVar22;
                local_478 = (long *)*puVar20;
              }
              puVar24 = puVar20 + 1;
              local_470 = puVar20[1];
              *puVar20 = plVar22;
            }
            *puVar24 = 0;
            *(undefined1 *)plVar22 = 0;
            strlen((char *)pBVar9);
            puVar24 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)pBVar9);
            local_4c0._0_8_ = local_4c0 + 0x10;
            plVar22 = puVar24 + 2;
            if ((long *)*puVar24 == plVar22) {
              local_4c0._16_8_ = *plVar22;
              local_4c0._24_8_ = puVar24[3];
            }
            else {
              local_4c0._16_8_ = *plVar22;
              local_4c0._0_8_ = (long *)*puVar24;
            }
            local_4c0._8_8_ = puVar24[1];
            *puVar24 = plVar22;
            puVar24[1] = 0;
            *(undefined1 *)(puVar24 + 2) = 0;
            if (local_478 != &local_468) {
              operator_delete(local_478,local_468 + 1);
            }
            if (0 < iVar17) {
              if (local_410 != &local_400) {
                operator_delete(local_410,local_400 + 1);
              }
              if (local_1e8[0] != local_1d8) {
                operator_delete(local_1e8[0],local_1d8[0] + 1);
              }
            }
            iVar15 = BufferLayout::getBlockIndex(local_480,(string *)local_4c0);
            pBVar21 = *(pointer *)
                       &(pBVar6->m_variables).
                        super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                        ._M_impl;
            if (pBVar21 !=
                *(pointer *)
                 ((long)&(pBVar6->m_variables).
                         super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                 + 8)) {
              pBVar11 = (((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                           *)&local_490->m_name)->_M_impl).super__Vector_impl_data._M_start;
              pVVar38 = &pBVar21->m_type;
              do {
                if ((pVVar38[1].m_type & 0x200) != TYPE_BASIC) {
                  glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar38);
                  anon_unknown_15::generateCompareSrc
                            ((ostream *)local_1a8,(char *)local_480,(BufferLayout *)pBVar6,block,
                             iVar15 * 0x10 + (int)pBVar11,
                             (BlockDataPtr *)((long)&pVVar38[-2].m_data + 8),(BufferVar *)local_3d0,
                             (SubTypeAccess *)CONCAT44(in_stack_fffffffffffffb24,MVar4),
                             (MatrixLoadFlags)pSVar46);
                  if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)0x0) {
                    operator_delete((void *)local_3c8._16_8_,
                                    CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                    local_3c8._16_8_);
                  }
                  glu::VarType::~VarType((VarType *)local_3d0);
                }
                pVVar14 = pVVar38 + 1;
                pVVar38 = (VarType *)((long)&pVVar38[2].m_data + 8);
              } while ((pointer)&pVVar14->m_data !=
                       *(pointer *)
                        ((long)&(pBVar6->m_variables).
                                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                        + 8));
            }
            if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
              operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
            }
            uVar40 = (int)block + 1;
            block = (BufferBlock *)(ulong)uVar40;
          } while (uVar40 != (uint)local_488);
          uVar41 = local_458 + 1;
          ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                     super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while ((long)uVar41 <
                 (long)(int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar29) >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tif (allOk)\n",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\t\tac_numPassed++;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar29) >> 3)
         ) {
        pvVar35 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)0x0;
        do {
          pBVar6 = ppBVar29[(long)pvVar35];
          iVar17 = pBVar6->m_arraySize;
          iVar15 = 1;
          if (1 < iVar17) {
            iVar15 = iVar17;
          }
          local_488 = CONCAT71(local_488._1_7_,0 < iVar17);
          if (iVar17 < 1) {
            iVar15 = 1;
          }
          iVar42 = 0;
          local_490 = (pointer)pvVar35;
          do {
            pcVar43 = (pBVar6->m_blockName)._M_dataplus._M_p;
            if (iVar17 < 1) {
              puVar24 = &local_470;
              plVar22 = &local_468;
              local_478 = &local_468;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
              std::ostream::operator<<((BufferVar *)local_3d0,iVar42);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
              std::ios_base::~ios_base(local_360);
              plVar22 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_1c8,0,(char *)0x0,0xb561c0);
              local_438 = &local_428;
              plVar32 = plVar22 + 2;
              if ((long *)*plVar22 == plVar32) {
                local_428 = *plVar32;
                lStack_420 = plVar22[3];
              }
              else {
                local_428 = *plVar32;
                local_438 = (long *)*plVar22;
              }
              local_430 = plVar22[1];
              *plVar22 = (long)plVar32;
              plVar22[1] = 0;
              *(undefined1 *)(plVar22 + 2) = 0;
              puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
              plVar22 = puVar20 + 2;
              if ((long *)*puVar20 == plVar22) {
                local_468 = *plVar22;
                uStack_460 = puVar20[3];
                local_478 = &local_468;
              }
              else {
                local_468 = *plVar22;
                local_478 = (long *)*puVar20;
              }
              puVar24 = puVar20 + 1;
              local_470 = puVar20[1];
              *puVar20 = plVar22;
            }
            *puVar24 = 0;
            *(undefined1 *)plVar22 = 0;
            strlen(pcVar43);
            puVar24 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)pcVar43);
            local_4c0._0_8_ = local_4c0 + 0x10;
            plVar22 = puVar24 + 2;
            if ((long *)*puVar24 == plVar22) {
              local_4c0._16_8_ = *plVar22;
              local_4c0._24_8_ = puVar24[3];
            }
            else {
              local_4c0._16_8_ = *plVar22;
              local_4c0._0_8_ = (long *)*puVar24;
            }
            local_4c0._8_8_ = puVar24[1];
            *puVar24 = plVar22;
            puVar24[1] = 0;
            *(undefined1 *)(puVar24 + 2) = 0;
            if (local_478 != &local_468) {
              operator_delete(local_478,local_468 + 1);
            }
            if (0 < iVar17) {
              if (local_438 != &local_428) {
                operator_delete(local_438,local_428 + 1);
              }
              if (local_1c8[0] != local_1b8) {
                operator_delete(local_1c8[0],local_1b8[0] + 1);
              }
            }
            iVar19 = BufferLayout::getBlockIndex(local_480,(string *)local_4c0);
            pBVar21 = (pBVar6->m_variables).
                      super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pBVar21 !=
                (pBVar6->m_variables).
                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pBVar11 = (local_450->
                        super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pVVar38 = &pBVar21->m_type;
              do {
                if ((pVVar38[1].m_type & 0x400) != TYPE_BASIC) {
                  glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)local_3d0,pVVar38);
                  anon_unknown_15::generateWriteSrc
                            ((ostream *)local_1a8,local_480,pBVar6,iVar42,pBVar11 + iVar19,
                             (BufferVar *)((long)&pVVar38[-2].m_data + 8),(SubTypeAccess *)local_3d0
                            );
                  if ((_Rb_tree_node_base *)local_3c8._16_8_ != (_Rb_tree_node_base *)0x0) {
                    operator_delete((void *)local_3c8._16_8_,
                                    CONCAT44(DStack_3a8.basic.precision,DStack_3a8.basic.type) -
                                    local_3c8._16_8_);
                  }
                  glu::VarType::~VarType((VarType *)local_3d0);
                }
                pVVar14 = pVVar38 + 1;
                pVVar38 = (VarType *)((long)&pVVar38[2].m_data + 8);
              } while ((pointer)&pVVar14->m_data !=
                       (pBVar6->m_variables).
                       super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
              operator_delete((void *)local_4c0._0_8_,(ulong)(local_4c0._16_8_ + 1));
            }
            iVar42 = iVar42 + 1;
          } while (iVar42 != iVar15);
          pvVar35 = (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
                    ((long)&(((_Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                               *)&local_490->m_name)->_M_impl).super__Vector_impl_data._M_start + 1)
          ;
          ppBVar29 = (pSVar46->m_interface).m_bufferBlocks.
                     super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while ((long)pvVar35 <
                 (long)(int)((ulong)((long)(pSVar46->m_interface).m_bufferBlocks.
                                           super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar29) >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
      std::__cxx11::stringbuf::str();
      if ((pointer)local_258._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._0_8_,(long)local_248 - local_258._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::operator=((string *)&pSVar46->m_computeShaderSrc,(string *)local_3d0);
      pcVar30 = local_3c8 + 8;
      if (local_3d0 != (undefined1  [8])pcVar30) {
        operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
        pcVar30 = extraout_RAX;
      }
      return (int)pcVar30;
    }
  } while( true );
}

Assistant:

void SSBOLayoutCase::init ()
{
	computeReferenceLayout	(m_refLayout, m_interface);
	initRefDataStorage		(m_interface, m_refLayout, m_initialData);
	initRefDataStorage		(m_interface, m_refLayout, m_writeData);
	generateValues			(m_refLayout, m_initialData.pointers, deStringHash(getName()) ^ 0xad2f7214);
	generateValues			(m_refLayout, m_writeData.pointers, deStringHash(getName()) ^ 0x25ca4e7);
	copyNonWrittenData		(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers);

	m_computeShaderSrc = generateComputeShader(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers, m_matrixLoadFlag);

}